

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall tetgenio::load_plc(tetgenio *this,char *filebasename,int object)

{
  bool bVar1;
  
  switch(object) {
  case 0:
    bVar1 = load_node(this,filebasename);
    break;
  default:
    bVar1 = load_poly(this,filebasename);
    break;
  case 2:
    bVar1 = load_off(this,filebasename);
    break;
  case 3:
    bVar1 = load_ply(this,filebasename);
    break;
  case 4:
    bVar1 = load_stl(this,filebasename);
    break;
  case 5:
    bVar1 = load_medit(this,filebasename,0);
    break;
  case 6:
    bVar1 = load_vtk(this,filebasename);
  }
  if (bVar1 != false) {
    load_edge(this,filebasename);
    load_var(this,filebasename);
    load_mtr(this,filebasename);
  }
  return bVar1;
}

Assistant:

bool tetgenio::load_plc(char* filebasename, int object)
{
  bool success;

  if (object == (int) tetgenbehavior::NODES) {
    success = load_node(filebasename);
  } else if (object == (int) tetgenbehavior::POLY) {
    success = load_poly(filebasename);
  } else if (object == (int) tetgenbehavior::OFF) {
    success = load_off(filebasename);
  } else if (object == (int) tetgenbehavior::PLY) {
    success = load_ply(filebasename);
  } else if (object == (int) tetgenbehavior::STL) {
    success = load_stl(filebasename);
  } else if (object == (int) tetgenbehavior::MEDIT) {
    success = load_medit(filebasename, 0);
  } else if (object == (int) tetgenbehavior::VTK) {
    success = load_vtk(filebasename);
  } else {
    success = load_poly(filebasename);
  }

  if (success) {
    // Try to load the following files (.edge, .var, .mtr).
    load_edge(filebasename);
    load_var(filebasename);
    load_mtr(filebasename);
  }

  return success;
}